

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
::
nosize_unchecked_emplace_at<std::pair<slang::ast::ValueSymbol_const*&&,slang::IntervalMap<unsigned_long,std::monostate,3u>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<const_slang::ast::ValueSymbol_*&&,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_&&>
          *args)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  group_type_pointer pgVar5;
  IntervalMap<unsigned_long,_std::monostate,_3U> *pIVar6;
  ulong uVar7;
  uint uVar8;
  ushort uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  unsigned_long uVar13;
  unsigned_long uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pgVar5 = arrays_->groups_;
  lVar15 = pos0 * 0x10;
  pgVar1 = pgVar5 + pos0;
  auVar18[0] = -(pgVar1->m[0].n == '\0');
  auVar18[1] = -(pgVar1->m[1].n == '\0');
  auVar18[2] = -(pgVar1->m[2].n == '\0');
  auVar18[3] = -(pgVar1->m[3].n == '\0');
  auVar18[4] = -(pgVar1->m[4].n == '\0');
  auVar18[5] = -(pgVar1->m[5].n == '\0');
  auVar18[6] = -(pgVar1->m[6].n == '\0');
  auVar18[7] = -(pgVar1->m[7].n == '\0');
  auVar18[8] = -(pgVar1->m[8].n == '\0');
  auVar18[9] = -(pgVar1->m[9].n == '\0');
  auVar18[10] = -(pgVar1->m[10].n == '\0');
  auVar18[0xb] = -(pgVar1->m[0xb].n == '\0');
  auVar18[0xc] = -(pgVar1->m[0xc].n == '\0');
  auVar18[0xd] = -(pgVar1->m[0xd].n == '\0');
  auVar18[0xe] = -(pgVar1->m[0xe].n == '\0');
  auVar18[0xf] = -(pgVar1->m[0xf].n == '\0');
  uVar17 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
  if (uVar17 == 0) {
    uVar7 = arrays_->groups_size_mask;
    lVar16 = 1;
    do {
      pgVar5[pos0].m[0xf].n = pgVar5[pos0].m[0xf].n | '\x01' << ((byte)hash & 7);
      pos0 = pos0 + lVar16 & uVar7;
      lVar15 = pos0 * 0x10;
      pgVar1 = pgVar5 + pos0;
      auVar19[0] = -(pgVar1->m[0].n == '\0');
      auVar19[1] = -(pgVar1->m[1].n == '\0');
      auVar19[2] = -(pgVar1->m[2].n == '\0');
      auVar19[3] = -(pgVar1->m[3].n == '\0');
      auVar19[4] = -(pgVar1->m[4].n == '\0');
      auVar19[5] = -(pgVar1->m[5].n == '\0');
      auVar19[6] = -(pgVar1->m[6].n == '\0');
      auVar19[7] = -(pgVar1->m[7].n == '\0');
      auVar19[8] = -(pgVar1->m[8].n == '\0');
      auVar19[9] = -(pgVar1->m[9].n == '\0');
      auVar19[10] = -(pgVar1->m[10].n == '\0');
      auVar19[0xb] = -(pgVar1->m[0xb].n == '\0');
      auVar19[0xc] = -(pgVar1->m[0xc].n == '\0');
      auVar19[0xd] = -(pgVar1->m[0xd].n == '\0');
      auVar19[0xe] = -(pgVar1->m[0xe].n == '\0');
      auVar19[0xf] = -(pgVar1->m[0xf].n == '\0');
      uVar9 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe;
      uVar17 = (uint)uVar9;
      lVar16 = lVar16 + 1;
    } while (uVar9 == 0);
  }
  uVar8 = 0;
  if (uVar17 != 0) {
    for (; (uVar17 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
    }
  }
  ppVar2 = arrays_->elements_ + pos0 * 0xf + (ulong)uVar8;
  ppVar2->first = *args->first;
  pIVar6 = args->second;
  (ppVar2->second).height = 0;
  (ppVar2->second).rootSize = 0;
  uVar3 = pIVar6->height;
  (ppVar2->second).height = uVar3;
  uVar4 = pIVar6->rootSize;
  pIVar6->rootSize = 0;
  (ppVar2->second).rootSize = uVar4;
  if (uVar3 == 0) {
    *(undefined8 *)
     &(ppVar2->second).field_0.rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
      field_0x30 = *(undefined8 *)
                    &(pIVar6->field_0).rootLeaf.
                     super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>
                     .field_0x30;
    uVar10 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[0].left;
    uVar11 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[0].right;
    uVar12 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[1].left;
    uVar13 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[1].right;
    uVar14 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = (pIVar6->field_0).rootLeaf.
           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
           first[2].left;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = uVar14;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = uVar12;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = uVar13;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = uVar10;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = uVar11;
  }
  else {
    uVar10 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[0].left;
    uVar11 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[0].right;
    uVar12 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[1].left;
    uVar13 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[1].right;
    uVar14 = (pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = (pIVar6->field_0).rootLeaf.
           super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
           first[2].left;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = uVar14;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = uVar12;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = uVar13;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = uVar10;
    (ppVar2->second).field_0.rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = uVar11;
    (pIVar6->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    left = 0;
    (pIVar6->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[0].
    right = 0;
    (pIVar6->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    left = 0;
    (pIVar6->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[1].
    right = 0;
    (pIVar6->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    left = 0;
    (pIVar6->field_0).rootLeaf.
    super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.first[2].
    right = 0;
    *(undefined8 *)
     ((long)&(pIVar6->field_0).rootLeaf.
             super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
             first[2].right + 4) = 0;
    *(undefined8 *)
     &(pIVar6->field_0).rootLeaf.
      super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_3U>.
      field_0x34 = 0;
  }
  (pgVar5->m + lVar15)[uVar8].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + (hash & 0xff));
  __return_storage_ptr__->pg =
       (group15<boost::unordered::detail::foa::plain_integral> *)(pgVar5->m + lVar15);
  __return_storage_ptr__->n = uVar8;
  __return_storage_ptr__->p = ppVar2;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }